

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf_writer.c
# Opt level: O2

_Bool duckdb_je_buf_writer_init
                (tsdn_t *tsdn,buf_writer_t *buf_writer,write_cb_t *write_cb,void *cbopaque,char *buf
                ,size_t buf_len)

{
  long *plVar1;
  ulong uVar2;
  void *pvVar3;
  ulong uVar4;
  _Bool _Var5;
  write_cb_t *pwVar6;
  byte bVar7;
  szind_t ind;
  uintptr_t uVar8;
  rtree_t *prVar9;
  size_t sVar10;
  rtree_metadata_t rVar11;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_contents_t local_1c8;
  
  pwVar6 = duckdb_je_malloc_message;
  if (duckdb_je_malloc_message == (write_cb_t *)0x0) {
    pwVar6 = duckdb_je_wrtmessage;
  }
  if (write_cb != (write_cb_t *)0x0) {
    pwVar6 = write_cb;
  }
  buf_writer->write_cb = pwVar6;
  buf_writer->cbopaque = cbopaque;
  if (buf == (char *)0x0) {
    if (buf_len < 0x1001) {
      ind = (szind_t)duckdb_je_sz_size2index_tab[buf_len + 7 >> 3];
    }
    else if (buf_len < 0x7000000000000001) {
      uVar2 = buf_len * 2 - 1;
      uVar4 = 0x3f;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      bVar7 = 0x3c - (char)(uVar4 ^ 0x3f);
      ind = (((uint)(uVar4 ^ 0x3f) ^ 0x3f) * 4 +
            ((uint)(((buf_len - 1 >> (bVar7 & 0x3f)) << (bVar7 & 0x3f)) >> (bVar7 & 0x3f)) & 3)) -
            0x17;
    }
    else {
      ind = 0xe8;
    }
    uVar8 = 0;
    buf = (char *)duckdb_je_arena_malloc_hard
                            (tsdn,(arena_t *)duckdb_je_arenas[0].repr,buf_len,ind,false,
                             buf_len < 0x3801);
    if ((rtree_ctx_t *)buf == (rtree_ctx_t *)0x0) {
      buf_writer->buf = (char *)0x0;
      buf_writer->internal_buf = true;
      _Var5 = true;
      sVar10 = 0;
      goto LAB_01f8b533;
    }
    if (tsdn == (tsdn_t *)0x0) {
      prVar9 = (rtree_t *)&stack0xfffffffffffffe50;
      duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar9);
    }
    else {
      prVar9 = (rtree_t *)
               &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    rtree_read(&local_1c8,tsdn,prVar9,(rtree_ctx_t *)buf,uVar8);
    uVar8 = (uintptr_t)((uint)(local_1c8.edata)->e_bits & 0xfff);
    pvVar3 = duckdb_je_arenas[uVar8].repr;
    if (tsdn == (tsdn_t *)0x0) {
      prVar9 = (rtree_t *)&stack0xfffffffffffffe50;
      duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar9);
    }
    else {
      prVar9 = (rtree_t *)
               &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    rVar11 = rtree_metadata_read(tsdn,prVar9,(rtree_ctx_t *)buf,uVar8);
    LOCK();
    plVar1 = (long *)((long)pvVar3 + 0x48);
    *plVar1 = *plVar1 + duckdb_je_sz_index2size_tab[rVar11.szind];
    UNLOCK();
    _Var5 = true;
  }
  else {
    _Var5 = false;
  }
  buf_writer->buf = buf;
  buf_writer->internal_buf = _Var5;
  sVar10 = buf_len - 1;
  _Var5 = false;
LAB_01f8b533:
  buf_writer->buf_size = sVar10;
  buf_writer->buf_end = 0;
  return _Var5;
}

Assistant:

bool
buf_writer_init(tsdn_t *tsdn, buf_writer_t *buf_writer, write_cb_t *write_cb,
    void *cbopaque, char *buf, size_t buf_len) {
	if (write_cb != NULL) {
		buf_writer->write_cb = write_cb;
	} else {
		buf_writer->write_cb = je_malloc_message != NULL ?
		    je_malloc_message : wrtmessage;
	}
	buf_writer->cbopaque = cbopaque;
	assert(buf_len >= 2);
	if (buf != NULL) {
		buf_writer->buf = buf;
		buf_writer->internal_buf = false;
	} else {
		buf_writer->buf = buf_writer_allocate_internal_buf(tsdn,
		    buf_len);
		buf_writer->internal_buf = true;
	}
	if (buf_writer->buf != NULL) {
		buf_writer->buf_size = buf_len - 1; /* Allowing for '\0'. */
	} else {
		buf_writer->buf_size = 0;
	}
	buf_writer->buf_end = 0;
	buf_writer_assert(buf_writer);
	return buf_writer->buf == NULL;
}